

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::openWriteFile
          (Highs *this,string *filename,string *method_name,FILE **file,HighsFileType *file_type)

{
  char cVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  HighsStatus HVar5;
  HighsStatus HVar6;
  
  *file_type = kFull;
  iVar2 = std::__cxx11::string::compare((char *)filename);
  if (iVar2 == 0) {
    *file = _stdout;
    HVar6 = kOk;
  }
  else {
    pFVar3 = fopen((filename->_M_dataplus)._M_p,"w");
    *file = (FILE *)pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Cannot open writable file \"%s\" in %s\n",(filename->_M_dataplus)._M_p,
                   (method_name->_M_dataplus)._M_p);
      HVar6 = kError;
    }
    else {
      pcVar4 = strrchr((filename->_M_dataplus)._M_p,0x2e);
      HVar5 = kOk;
      HVar6 = kOk;
      if (pcVar4 != (char *)0x0) {
        iVar2 = std::__cxx11::string::compare((char *)filename);
        HVar6 = HVar5;
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar4 + 1,"mps");
          if (iVar2 == 0) {
            *file_type = kMps;
          }
          else {
            cVar1 = pcVar4[1];
            if (cVar1 == 'm') {
              if ((pcVar4[2] == 'd') && (pcVar4[3] == '\0')) {
                *file_type = kMd;
              }
            }
            else if (((cVar1 == 'l') && (pcVar4[2] == 'p')) && (pcVar4[3] == '\0')) {
              *file_type = kLp;
            }
          }
        }
      }
    }
  }
  return HVar6;
}

Assistant:

HighsStatus Highs::openWriteFile(const string filename,
                                 const string method_name, FILE*& file,
                                 HighsFileType& file_type) const {
  file_type = HighsFileType::kFull;
  if (filename == "") {
    // Empty file name: use stdout
    file = stdout;
  } else {
    file = fopen(filename.c_str(), "w");
    if (file == 0) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Cannot open writable file \"%s\" in %s\n", filename.c_str(),
                   method_name.c_str());
      return HighsStatus::kError;
    }
    const char* dot = strrchr(filename.c_str(), '.');
    if (dot && dot != filename) {
      if (strcmp(dot + 1, "mps") == 0) {
        file_type = HighsFileType::kMps;
      } else if (strcmp(dot + 1, "lp") == 0) {
        file_type = HighsFileType::kLp;
      } else if (strcmp(dot + 1, "md") == 0) {
        file_type = HighsFileType::kMd;
      }
    }
  }
  return HighsStatus::kOk;
}